

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_color_stats_add(LodePNGColorStats *stats,uint r,uint g,uint b,uint a)

{
  uint uVar1;
  uchar image [8];
  uchar local_30;
  undefined1 local_2f;
  undefined1 local_2e;
  undefined1 local_2d;
  undefined1 local_2c;
  undefined1 local_2b;
  undefined2 local_2a;
  LodePNGColorMode local_28;
  
  local_28.key_defined = 0;
  local_28.key_r = 0;
  local_28.key_g = 0;
  local_28.key_b = 0;
  local_28.palette = (uchar *)0x0;
  local_28.palettesize = 0;
  local_30 = (uchar)(r >> 8);
  local_2f = (undefined1)r;
  local_2e = (undefined1)(g >> 8);
  local_2d = (undefined1)g;
  local_2c = (undefined1)(b >> 8);
  local_2b = (undefined1)b;
  local_2a = 0xffff;
  local_28.colortype = LCT_RGBA;
  local_28.bitdepth = 0x10;
  uVar1 = lodepng_compute_color_stats(stats,&local_30,1,1,&local_28);
  return uVar1;
}

Assistant:

static unsigned lodepng_color_stats_add(LodePNGColorStats* stats,
                                        unsigned r, unsigned g, unsigned b, unsigned a) {
  unsigned error = 0;
  unsigned char image[8];
  LodePNGColorMode mode;
  lodepng_color_mode_init(&mode);
  image[0] = r >> 8; image[1] = r; image[2] = g >> 8; image[3] = g;
  image[4] = b >> 8; image[5] = b; image[6] = a >> 8; image[7] = a;
  mode.bitdepth = 16;
  mode.colortype = LCT_RGBA;
  error = lodepng_compute_color_stats(stats, image, 1, 1, &mode);
  lodepng_color_mode_cleanup(&mode);
  return error;
}